

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall JsonString_FourFs_Test::JsonString_FourFs_Test(JsonString_FourFs_Test *this)

{
  JsonString_FourFs_Test *this_local;
  
  anon_unknown.dwarf_1403f7::JsonString::JsonString(&this->super_JsonString);
  (this->super_JsonString).super_Test._vptr_Test =
       (_func_int **)&PTR__JsonString_FourFs_Test_0025bee0;
  return;
}

Assistant:

TEST_F (JsonString, FourFs) {
    // Note that there is no unicode code-point at U+FFFF.
    EXPECT_CALL (callbacks_, string_value ("\xEF\xBF\xBF")).Times (1);

    auto p = json::make_parser (proxy_);
    p.input ("\"\\uFFFF\"").eof ();
    EXPECT_FALSE (p.has_error ()) << "Expected the parse to succeed";
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
    EXPECT_EQ (p.coordinate (), (json::coord{9U, 1U}));
}